

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void __thiscall
duckdb::Linenoise::NextPosition
          (Linenoise *this,char *buf,size_t len,size_t *cpos,int *rows,int *cols,int plen)

{
  ulong uVar1;
  int32_t iVar2;
  int iVar3;
  int sz;
  int local_34;
  size_t sVar4;
  
  sVar4 = *cpos;
  if ((buf[sVar4] == '\r') || (buf[sVar4] == '\n')) {
    *rows = *rows + 1;
    *cols = plen;
    uVar1 = sVar4 + 1;
    *cpos = uVar1;
    if (((uVar1 < len) && (buf[sVar4] == '\r')) && (buf[uVar1] == '\n')) {
      *cpos = sVar4 + 2;
    }
  }
  else {
    iVar2 = Utf8Proc::UTF8ToCodepoint(buf + sVar4,&local_34);
    if (iVar2 < 0) {
      sVar4 = *cpos + 1;
      iVar3 = 1;
    }
    else {
      sVar4 = Utf8Proc::RenderWidth(buf,len,*cpos);
      iVar3 = (int)sVar4;
      sVar4 = Utf8Proc::NextGraphemeCluster(buf,len,*cpos);
    }
    *cpos = sVar4;
    if ((this->ws).ws_col < *cols + iVar3) {
      *rows = *rows + 1;
      *cols = iVar3;
    }
    *cols = *cols + iVar3;
  }
  return;
}

Assistant:

void Linenoise::NextPosition(const char *buf, size_t len, size_t &cpos, int &rows, int &cols, int plen) const {
	if (IsNewline(buf[cpos])) {
		// explicit newline! move to next line and insert a prompt
		rows++;
		cols = plen;
		cpos++;
		if (buf[cpos - 1] == '\r' && cpos < len && buf[cpos] == '\n') {
			cpos++;
		}
		return;
	}
	int sz;
	int char_render_width;
	if (duckdb::Utf8Proc::UTF8ToCodepoint(buf + cpos, sz) < 0) {
		char_render_width = 1;
		cpos++;
	} else {
		char_render_width = (int)duckdb::Utf8Proc::RenderWidth(buf, len, cpos);
		cpos = duckdb::Utf8Proc::NextGraphemeCluster(buf, len, cpos);
	}
	if (cols + char_render_width > ws.ws_col) {
		// exceeded l->cols, move to next row
		rows++;
		cols = char_render_width;
	}
	cols += char_render_width;
}